

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QWindow * __thiscall QWidgetPrivate::windowHandle(QWidgetPrivate *this,WindowHandleMode mode)

{
  QWExtra *pQVar1;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar2;
  QWidget *this_00;
  QWindow *pQVar3;
  QWidget *pQVar4;
  
  if (mode < TopLevel) {
    pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar1 == (QWExtra *)0x0) ||
       (tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
              &(pQVar1->topextra)._M_t.
               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
       tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl ==
       (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) {
      if (mode != Closest) {
        return (QWindow *)0x0;
      }
    }
    else {
      pQVar3 = *(QWindow **)
                ((long)tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20);
      if (mode == Direct) {
        return pQVar3;
      }
      if (pQVar3 != (QWindow *)0x0) {
        return pQVar3;
      }
    }
    pQVar4 = *(QWidget **)&this->field_0x8;
    this_00 = QWidget::nativeParentWidget(pQVar4);
    if ((this_00 != (QWidget *)0x0) &&
       (pQVar3 = QWidget::windowHandle(this_00), pQVar3 != (QWindow *)0x0)) {
      return pQVar3;
    }
  }
  else {
    if (mode != TopLevel) {
      return (QWindow *)0x0;
    }
    pQVar4 = *(QWidget **)&this->field_0x8;
  }
  pQVar4 = QWidget::window(pQVar4);
  if ((pQVar4 != (QWidget *)0x0) &&
     (pQVar3 = QWidget::windowHandle(pQVar4), pQVar3 != (QWindow *)0x0)) {
    return pQVar3;
  }
  return (QWindow *)0x0;
}

Assistant:

QWindow *QWidgetPrivate::windowHandle(WindowHandleMode mode) const
{
    if (mode == WindowHandleMode::Direct || mode == WindowHandleMode::Closest) {
        if (QTLWExtra *x = maybeTopData()) {
            if (x->window != nullptr || mode == WindowHandleMode::Direct)
                return x->window;
        }
    }
    if (mode == WindowHandleMode::Closest) {
        // FIXME: Use closestParentWidgetWithWindowHandle instead
        if (auto nativeParent = q_func()->nativeParentWidget()) {
            if (auto window = nativeParent->windowHandle())
                return window;
        }
    }
    if (mode == WindowHandleMode::TopLevel || mode == WindowHandleMode::Closest) {
        if (auto topLevel = q_func()->topLevelWidget()) {
            if (auto window = topLevel ->windowHandle())
                return window;
        }
    }
    return nullptr;
}